

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compress_usingDict
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,int compressionLevel)

{
  ZSTD_useRowMatchFinderMode_e ZVar1;
  size_t sVar2;
  int iVar3;
  ZSTD_parameters params;
  
  sVar2 = dictSize;
  if (dict == (void *)0x0) {
    sVar2 = 0;
  }
  ZSTD_getCParams_internal(&params.cParams,compressionLevel,srcSize,sVar2,ZSTD_cpm_noAttachDict);
  params.fParams.noDictIDFlag = 0;
  params.fParams.contentSizeFlag = 1;
  params.fParams.checksumFlag = 0;
  iVar3 = 3;
  if (compressionLevel != 0) {
    iVar3 = compressionLevel;
  }
  memset(&cctx->simpleApiParams,0,0xb0);
  (cctx->simpleApiParams).cParams.windowLog = params.cParams.windowLog;
  (cctx->simpleApiParams).cParams.chainLog = params.cParams.chainLog;
  (cctx->simpleApiParams).cParams.hashLog = params.cParams.hashLog;
  (cctx->simpleApiParams).cParams.searchLog = params.cParams.searchLog;
  (cctx->simpleApiParams).cParams.searchLog = params.cParams.searchLog;
  (cctx->simpleApiParams).cParams.minMatch = params.cParams.minMatch;
  (cctx->simpleApiParams).cParams.targetLength = params.cParams.targetLength;
  (cctx->simpleApiParams).cParams.strategy = params.cParams.strategy;
  (cctx->simpleApiParams).fParams.contentSizeFlag = params.fParams.contentSizeFlag;
  (cctx->simpleApiParams).fParams.checksumFlag = params.fParams.checksumFlag;
  (cctx->simpleApiParams).fParams.noDictIDFlag = params.fParams.noDictIDFlag;
  (cctx->simpleApiParams).compressionLevel = iVar3;
  ZVar1 = (cctx->simpleApiParams).useRowMatchFinder;
  if ((ZVar1 == ZSTD_urm_auto) &&
     (ZVar1 = ZSTD_urm_disableRowMatchFinder, 0xfffffffc < params.cParams.strategy - ZSTD_btlazy2))
  {
    ZVar1 = ZSTD_urm_enableRowMatchFinder - (params.cParams.windowLog < 0xf);
  }
  (cctx->simpleApiParams).useRowMatchFinder = ZVar1;
  sVar2 = ZSTD_compress_advanced_internal
                    (cctx,dst,dstCapacity,src,srcSize,dict,dictSize,&cctx->simpleApiParams);
  return sVar2;
}

Assistant:

size_t ZSTD_compress_usingDict(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict, size_t dictSize,
                               int compressionLevel)
{
    {
        ZSTD_parameters const params = ZSTD_getParams_internal(compressionLevel, srcSize, dict ? dictSize : 0, ZSTD_cpm_noAttachDict);
        assert(params.fParams.contentSizeFlag == 1);
        ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams, &params, (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT: compressionLevel);
    }
    DEBUGLOG(4, "ZSTD_compress_usingDict (srcSize=%u)", (unsigned)srcSize);
    return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, dict, dictSize, &cctx->simpleApiParams);
}